

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O0

void __thiscall
ruckig::BrakeProfile::velocity_brake
          (BrakeProfile *this,double v0,double a0,double vMax,double vMin,double param_5,double aMin
          ,double jMax)

{
  reference pvVar1;
  double *pdVar2;
  int __x;
  array<double,_2UL> *this_00;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double t_to_v_min_with_constant;
  double t_to_v_max_with_constant;
  double v_at_a_min;
  double t_min_to_v_max;
  double t_to_v_min;
  double t_to_v_max;
  double t_to_a_min;
  double jMax_local;
  double aMin_local;
  double param_5_local;
  double vMin_local;
  double vMax_local;
  double a0_local;
  double v0_local;
  BrakeProfile *this_local;
  
  this_00 = &this->j;
  t_to_a_min = jMax;
  jMax_local = aMin;
  aMin_local = param_5;
  param_5_local = vMin;
  vMin_local = vMax;
  vMax_local = a0;
  a0_local = v0;
  v0_local = (double)this;
  pvVar1 = std::array<double,_2UL>::operator[](this_00,0);
  __x = (int)this_00;
  *pvVar1 = -jMax;
  t_to_v_max = (vMax_local - jMax_local) / t_to_a_min;
  dVar3 = vMax_local / t_to_a_min;
  dVar4 = sqrt(vMax_local * vMax_local + t_to_a_min * 2.0 * (a0_local - vMin_local));
  std::abs(__x);
  t_to_v_min = dVar3 + dVar4 / extraout_XMM0_Qa;
  dVar3 = vMax_local / t_to_a_min;
  dVar4 = sqrt(t_to_a_min * (a0_local - param_5_local) + (vMax_local * vMax_local) / 2.0);
  std::abs(__x);
  t_min_to_v_max = dVar3 + dVar4 / extraout_XMM0_Qa_00;
  pdVar2 = std::min<double>(&t_to_v_min,&t_min_to_v_max);
  v_at_a_min = *pdVar2;
  if (v_at_a_min <= t_to_v_max) {
    local_a0 = v_at_a_min - 2.2e-14;
    local_a8 = 0.0;
    pdVar2 = std::max<double>(&local_a0,&local_a8);
    dVar3 = *pdVar2;
    pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
    *pvVar1 = dVar3;
  }
  else {
    t_to_v_max_with_constant = v_at_t(a0_local,vMax_local,-t_to_a_min,t_to_v_max);
    t_to_v_min_with_constant = -(t_to_v_max_with_constant - vMin_local) / jMax_local;
    local_80 = jMax_local / (t_to_a_min * 2.0) -
               (t_to_v_max_with_constant - param_5_local) / jMax_local;
    local_88 = t_to_v_max - 2.2e-14;
    local_90 = 0.0;
    pdVar2 = std::max<double>(&local_88,&local_90);
    dVar3 = *pdVar2;
    pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
    *pvVar1 = dVar3;
    pdVar2 = std::min<double>(&t_to_v_min_with_constant,&local_80);
    local_98 = 0.0;
    pdVar2 = std::max<double>(pdVar2,&local_98);
    dVar3 = *pdVar2;
    pvVar1 = std::array<double,_2UL>::operator[](&this->t,1);
    *pvVar1 = dVar3;
  }
  return;
}

Assistant:

void BrakeProfile::velocity_brake(double v0, double a0, double vMax, double vMin, double, double aMin, double jMax) {
    j[0] = -jMax;
    const double t_to_a_min = (a0 - aMin)/jMax;
    const double t_to_v_max = a0/jMax + std::sqrt(a0*a0 + 2 * jMax * (v0 - vMax)) / std::abs(jMax);
    const double t_to_v_min = a0/jMax + std::sqrt(a0*a0 / 2 + jMax * (v0 - vMin)) / std::abs(jMax);
    const double t_min_to_v_max = std::min(t_to_v_max, t_to_v_min);

    if (t_to_a_min < t_min_to_v_max) {
        const double v_at_a_min = v_at_t(v0, a0, -jMax, t_to_a_min);
        const double t_to_v_max_with_constant = -(v_at_a_min - vMax)/aMin;
        const double t_to_v_min_with_constant = aMin/(2*jMax) - (v_at_a_min - vMin)/aMin;

        t[0] = std::max(t_to_a_min - eps, 0.0);
        t[1] = std::max(std::min(t_to_v_max_with_constant, t_to_v_min_with_constant), 0.0);

    } else {
        t[0] = std::max(t_min_to_v_max - eps, 0.0);
    }
}